

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::SectionTracking::TestCaseTracker::enterSection(TestCaseTracker *this,string *name)

{
  RunState RVar1;
  TrackedSection *this_00;
  long in_RDI;
  TrackedSection *child;
  string *in_stack_00000110;
  TrackedSection *in_stack_00000118;
  
  this_00 = TrackedSection::acquireChild(in_stack_00000118,in_stack_00000110);
  if (((*(byte *)(in_RDI + 0x68) & 1) == 0) &&
     (RVar1 = TrackedSection::runState(this_00), RVar1 != Completed)) {
    *(TrackedSection **)(in_RDI + 0x60) = this_00;
    TrackedSection::enter(*(TrackedSection **)(in_RDI + 0x60));
    return true;
  }
  return false;
}

Assistant:

bool enterSection( std::string const& name ) {
            TrackedSection* child = m_currentSection->acquireChild( name );
            if( m_completedASectionThisRun || child->runState() == TrackedSection::Completed )
                return false;

            m_currentSection = child;
            m_currentSection->enter();
            return true;
        }